

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall gss::innards::Proof::finalise_model(Proof *this)

{
  ostreambuf_iterator<char,_std::char_traits<char>_> __result;
  ostreambuf_iterator<char,_std::char_traits<char>_> __result_00;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  istreambuf_iterator<char,_std::char_traits<char>_> __last_00;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __first_00;
  byte bVar1;
  byte bVar2;
  type pbVar3;
  ostream *poVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  pointer pIVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  string *m;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  f;
  string *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  streambuf_type *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13c704);
  std::make_unique<std::ofstream,std::__cxx11::string&>(in_stack_fffffffffffffdf8);
  std::unique_ptr<std::ostream,std::default_delete<std::ostream>>::
  unique_ptr<std::ofstream,std::default_delete<std::ofstream>,void>
            ((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
              *)in_stack_fffffffffffffde8);
  std::
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  pbVar3 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  poVar4 = std::operator<<(pbVar3,"* #variable= ");
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13c788);
  sVar5 = std::
          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x13c797);
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13c7ac);
  sVar6 = std::
          map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x13c7bb);
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13c7de);
  sVar7 = std::
          map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x13c7ed);
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13c810);
  sVar8 = std::
          map<std::tuple<long,_long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((map<std::tuple<long,_long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x13c81f);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5 + sVar6 + sVar7 + sVar8);
  poVar4 = std::operator<<(poVar4," #constraint= ");
  pIVar9 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13c86c);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pIVar9->nb_constraints);
  std::operator<<(poVar4,'\n');
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13c8ab);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            (in_stack_fffffffffffffdf0,(istream_type *)in_stack_fffffffffffffde8);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::ostreambuf_iterator<char,_std::char_traits<char>_>::ostreambuf_iterator
            ((ostreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0,
             (ostream_type *)in_stack_fffffffffffffde8);
  __first._8_8_ = in_stack_fffffffffffffe08;
  __first._M_sbuf = in_stack_fffffffffffffe00;
  __last._8_8_ = in_stack_fffffffffffffdf8;
  __last._M_sbuf = (streambuf_type *)in_stack_fffffffffffffdf0;
  __result._M_sbuf._7_1_ = in_stack_fffffffffffffde7;
  __result._M_sbuf._0_7_ = in_stack_fffffffffffffde0;
  __result._8_8_ = in_stack_fffffffffffffde8;
  std::copy<char>(__first,__last,__result);
  pIVar9 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13c964);
  std::ios::clear((int)pIVar9 + 0x1c8 +
                  (int)*(undefined8 *)(*(long *)&pIVar9->model_prelude_stream + -0x18));
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13c98d);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            (in_stack_fffffffffffffdf0,(istream_type *)in_stack_fffffffffffffde8);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::ostreambuf_iterator<char,_std::char_traits<char>_>::ostreambuf_iterator
            ((ostreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0,
             (ostream_type *)in_stack_fffffffffffffde8);
  __first_00._8_8_ = in_stack_fffffffffffffe08;
  __first_00._M_sbuf = in_stack_fffffffffffffe00;
  __last_00._8_8_ = in_stack_fffffffffffffdf8;
  __last_00._M_sbuf = (streambuf_type *)in_stack_fffffffffffffdf0;
  __result_00._M_sbuf._7_1_ = in_stack_fffffffffffffde7;
  __result_00._M_sbuf._0_7_ = in_stack_fffffffffffffde0;
  __result_00._8_8_ = in_stack_fffffffffffffde8;
  std::copy<char>(__first_00,__last_00,__result_00);
  pIVar9 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13ca37);
  std::ios::clear((int)pIVar9 + 0x40 + (int)*(undefined8 *)(*(long *)&pIVar9->model_stream + -0x18))
  ;
  pbVar3 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  bVar1 = std::ios::operator!(pbVar3 + *(long *)(*(long *)pbVar3 + -0x18));
  if ((bVar1 & 1) != 0) {
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x28);
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x13caac);
    std::operator+((char *)CONCAT17(bVar1,in_stack_fffffffffffffe28),pbVar10);
    std::operator+(in_stack_fffffffffffffde8,
                   (char *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    ProofError::ProofError
              ((ProofError *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    __cxa_throw(pbVar10,&ProofError::typeinfo,ProofError::~ProofError);
  }
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13cbb5);
  std::make_unique<std::ofstream,std::__cxx11::string&>(in_stack_fffffffffffffdf8);
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13cbd8);
  std::unique_ptr<std::ostream,std::default_delete<std::ostream>>::operator=
            ((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
              *)in_stack_fffffffffffffde8);
  std::
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13cc0b);
  pbVar3 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::operator<<(pbVar3,"pseudo-Boolean proof version 2.0\n");
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13cc41);
  pbVar3 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  poVar4 = std::operator<<(pbVar3,"f ");
  pIVar9 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13cc7c);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pIVar9->nb_constraints);
  std::operator<<(poVar4," 0\n");
  pIVar9 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13ccb4);
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            pIVar9->nb_constraints;
  pIVar9 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13cccd);
  pIVar9->proof_line = (long)&(pbVar10->_M_dataplus)._M_p + pIVar9->proof_line;
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13ccf0);
  pbVar3 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  bVar2 = std::ios::operator!(pbVar3 + *(long *)(*(long *)pbVar3 + -0x18));
  if ((bVar2 & 1) == 0) {
    std::
    unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   *)pbVar3);
    return;
  }
  m = (string *)__cxa_allocate_exception(0x28);
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13cd50);
  std::operator+((char *)CONCAT17(bVar1,in_stack_fffffffffffffe28),in_stack_fffffffffffffe20);
  std::operator+(pbVar10,(char *)CONCAT17(bVar2,in_stack_fffffffffffffde0));
  ProofError::ProofError((ProofError *)CONCAT17(bVar2,in_stack_fffffffffffffde0),m);
  __cxa_throw(m,&ProofError::typeinfo,ProofError::~ProofError);
}

Assistant:

auto Proof::finalise_model() -> void
{
    unique_ptr<ostream> f = make_unique<ofstream>(_imp->opb_filename);

    *f << "* #variable= " << (_imp->variable_mappings.size() + _imp->binary_variable_mappings.size() + _imp->connected_variable_mappings.size() + _imp->connected_variable_mappings_aux.size())
       << " #constraint= " << _imp->nb_constraints << '\n';
    copy(istreambuf_iterator<char>{_imp->model_prelude_stream}, istreambuf_iterator<char>{}, ostreambuf_iterator<char>{*f});
    _imp->model_prelude_stream.clear();
    copy(istreambuf_iterator<char>{_imp->model_stream}, istreambuf_iterator<char>{}, ostreambuf_iterator<char>{*f});
    _imp->model_stream.clear();

    if (! *f)
        throw ProofError{"Error writing opb file to '" + _imp->opb_filename + "'"};

    _imp->proof_stream = make_unique<ofstream>(_imp->log_filename);

    *_imp->proof_stream << "pseudo-Boolean proof version 2.0\n";

    *_imp->proof_stream << "f " << _imp->nb_constraints << " 0\n";
    _imp->proof_line += _imp->nb_constraints;

    if (! *_imp->proof_stream)
        throw ProofError{"Error writing proof file to '" + _imp->log_filename + "'"};
}